

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O0

c_v256 * c_v256_cmpeq_16(c_v256 a,c_v256 b)

{
  c_v128 a_00;
  c_v128 a_01;
  c_v256 *in_RDI;
  c_v128 cVar1;
  c_v128 cVar2;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000030;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  a_00.u64[1] = in_stack_ffffffffffffffc0;
  a_00.u64[0] = in_stack_ffffffffffffffb8;
  cVar1.u64[1] = in_stack_ffffffffffffffb0;
  cVar1.u64[0] = in_stack_ffffffffffffffa8;
  cVar1 = c_v128_cmpeq_16(a_00,cVar1);
  a_01.u64[1] = in_stack_ffffffffffffffc0;
  a_01.u64[0] = in_stack_00000010;
  cVar2.u64[1] = in_stack_00000008;
  cVar2.u64[0] = in_stack_00000030;
  cVar2 = c_v128_cmpeq_16(a_01,cVar2);
  c_v256_from_v128(in_RDI,cVar1,cVar2);
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_cmpeq_16(c_v256 a, c_v256 b) {
  return c_v256_from_v128(c_v128_cmpeq_16(a.v128[1], b.v128[1]),
                          c_v128_cmpeq_16(a.v128[0], b.v128[0]));
}